

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O2

void DumpInternal(PtexTexture *tx)

{
  ostream *poVar1;
  int i;
  ulong uVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Header:\n");
  std::operator<<(poVar1,"  magic: ");
  if (*(int *)&tx[0x11]._vptr_PtexTexture == 0x78657450) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\'Ptex\'");
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  }
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"  version: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  meshtype: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  datatype: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  alphachan: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&tx[0x13]._vptr_PtexTexture);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  nchannels: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)((long)&tx[0x13]._vptr_PtexTexture + 4));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  nlevels: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)((long)&tx[0x13]._vptr_PtexTexture + 6));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  nfaces: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  extheadersize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  faceinfosize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  constdatasize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  levelinfosize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  leveldatasize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  metadatazipsize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  metadatamemsize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  ubordermode: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ushort *)&tx[0x19]._vptr_PtexTexture);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  vbordermode: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)((long)&tx[0x19]._vptr_PtexTexture + 4));
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  lmdheaderzipsize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  lmdheadermemsize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  lmddatasize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  editdatasize: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  editdatapos: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Level info:\n");
  for (uVar2 = 0; uVar2 < *(ushort *)((long)&tx[0x13]._vptr_PtexTexture + 6); uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"  Level ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar2);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"    leveldatasize: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"    levelheadersize: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"    nfaces: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void DumpInternal(PtexTexture* tx)
{
    PtexReader* r = static_cast<PtexReader*> (tx);

    const PtexIO::Header& h = r->header();
    const PtexIO::ExtHeader& eh = r->extheader();
    std::cout << "Header:\n"
              << "  magic: ";

    if (h.magic == PtexIO::Magic)
        std::cout << "'Ptex'" << std::endl;
    else
        std::cout << h.magic << std::endl;

    std::cout << "  version: " << h.version << '.' << h.minorversion << std::endl
              << "  meshtype: " << h.meshtype << std::endl
              << "  datatype: " << h.datatype << std::endl
              << "  alphachan: " << int(h.alphachan) << std::endl
              << "  nchannels: " << h.nchannels << std::endl
              << "  nlevels: " << h.nlevels << std::endl
              << "  nfaces: " << h.nfaces << std::endl
              << "  extheadersize: " << h.extheadersize << std::endl
              << "  faceinfosize: " << h.faceinfosize << std::endl
              << "  constdatasize: " << h.constdatasize << std::endl
              << "  levelinfosize: " << h.levelinfosize << std::endl
              << "  leveldatasize: " << h.leveldatasize << std::endl
              << "  metadatazipsize: " << h.metadatazipsize << std::endl
              << "  metadatamemsize: " << h.metadatamemsize << std::endl
              << "  ubordermode: " << eh.ubordermode << std::endl
              << "  vbordermode: " << eh.vbordermode << std::endl
              << "  lmdheaderzipsize: " << eh.lmdheaderzipsize << std::endl
              << "  lmdheadermemsize: " << eh.lmdheadermemsize << std::endl
              << "  lmddatasize: " << eh.lmddatasize << std::endl
              << "  editdatasize: " << eh.editdatasize << std::endl
              << "  editdatapos: " << eh.editdatapos << std::endl;

    std::cout << "Level info:\n";
    for (int i = 0; i < h.nlevels; i++) {
        const PtexIO::LevelInfo& l = r->levelinfo(i);
        std::cout << "  Level " << i << std::endl
                  << "    leveldatasize: " << l.leveldatasize << std::endl
                  << "    levelheadersize: " << l.levelheadersize << std::endl
                  << "    nfaces: " << l.nfaces << std::endl;
    }
}